

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

uint8_t __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler::
get_port_input(VIAPortHandler *this,Port port)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  Port port_local;
  VIAPortHandler *this_local;
  
  if (port == A) {
    this_local._7_1_ = 0;
  }
  else if (port == B) {
    uVar2 = Inputs::QuadratureMouse::get_button_mask(this->mouse_);
    bVar4 = 8;
    if ((uVar2 & 1) != 0) {
      bVar4 = 0;
    }
    uVar2 = Inputs::QuadratureMouse::get_channel(this->mouse_,0);
    uVar3 = Inputs::QuadratureMouse::get_channel(this->mouse_,1);
    bVar1 = Clock::SerialClock::get_data(this->clock_);
    bVar6 = 0;
    if (bVar1) {
      bVar6 = 2;
    }
    bVar1 = video_is_outputting(this->machine_);
    bVar5 = 0x40;
    if (bVar1) {
      bVar5 = 0;
    }
    this_local._7_1_ = bVar4 | (byte)((uVar2 & 2) << 3) | (byte)((uVar3 & 2) << 4) | bVar6 | bVar5;
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t get_port_input(Port port) {
					switch(port) {
						case Port::A:
//							printf("6522 r A\n");
						return 0x00;	// TODO: b7 = SCC wait/request

						case Port::B:
						return uint8_t(
							((mouse_.get_button_mask() & 1) ? 0x00 : 0x08) |
							((mouse_.get_channel(0) & 2) << 3) |
							((mouse_.get_channel(1) & 2) << 4) |
							(clock_.get_data() ? 0x02 : 0x00) |
							(machine_.video_is_outputting() ? 0x00 : 0x40)
						);
					}

					// Should be unreachable.
					return 0xff;
				}